

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cc
# Opt level: O2

void __thiscall
prometheus::detail::Endpoint::RegisterAuth
          (Endpoint *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *authCB,string *realm)

{
  BasicAuthHandler *pBVar1;
  BasicAuthHandler *pBVar2;
  BasicAuthHandler *in_RAX;
  pointer *__ptr;
  BasicAuthHandler *local_18;
  
  local_18 = in_RAX;
  make_unique<prometheus::BasicAuthHandler,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::__cxx11::string_const&>
            ((detail *)&local_18,authCB,realm);
  CivetServer::addAuthHandler(this->server_,&this->uri_,&local_18->super_CivetAuthHandler);
  pBVar2 = local_18;
  local_18 = (BasicAuthHandler *)0x0;
  pBVar1 = (this->auth_handler_)._M_t.
           super___uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
           ._M_t.
           super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
           .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl;
  (this->auth_handler_)._M_t.
  super___uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  ._M_t.
  super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
  .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl = pBVar2;
  if (pBVar1 != (BasicAuthHandler *)0x0) {
    (*(pBVar1->super_CivetAuthHandler)._vptr_CivetAuthHandler[1])();
    if (local_18 != (BasicAuthHandler *)0x0) {
      (**(code **)(*(long *)local_18 + 8))();
    }
  }
  return;
}

Assistant:

void Endpoint::RegisterAuth(
    std::function<bool(const std::string&, const std::string&)> authCB,
    const std::string& realm) {
  // split creating, assigning, and storing to avoid a race-condition when
  // being called the second time and the handler is replaced
  auto new_handler =
      detail::make_unique<BasicAuthHandler>(std::move(authCB), realm);
  server_.addAuthHandler(uri_, new_handler.get());
  auth_handler_ = std::move(new_handler);
}